

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

int __thiscall embree::XMLLoader::load<int>(XMLLoader *this,Ref<embree::XML> *xml)

{
  Token *this_00;
  int iVar1;
  runtime_error *this_01;
  long *plVar2;
  long *plVar3;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  string local_40;
  
  this_00 = (xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((long)(xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)this_00 == 0x48) {
    iVar1 = Token::Int(this_00);
    return iVar1;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&local_40,&xml->ptr->loc);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_60 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_60 == plVar3) {
    local_50 = *plVar3;
    lStack_48 = plVar2[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar3;
  }
  local_58 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error(this_01,(string *)&local_60);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Vec3f getVec3fa() const { return Vec3fa(f[0],f[1],f[2]); }